

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O1

void analyze_region(FIRSTPASS_STATS *stats,int k,REGIONS *regions)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long lVar6;
  int iVar7;
  FIRSTPASS_STATS *pFVar8;
  long lVar9;
  double num_frames;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  regions[k].avg_intra_err = 0.0;
  (&regions[k].avg_intra_err)[1] = 0.0;
  regions[k].avg_cor_coeff = 0.0;
  (&regions[k].avg_cor_coeff)[1] = 0.0;
  auVar5 = _DAT_00506e80;
  iVar1 = regions[k].start;
  lVar6 = (long)iVar1;
  iVar2 = regions[k].last;
  if (iVar1 <= iVar2) {
    dVar12 = (double)((iVar2 - iVar1) + 1);
    dVar10 = regions[k].avg_noise_var;
    dVar11 = regions[k].avg_cor_coeff;
    dVar13 = regions[k].avg_intra_err;
    dVar14 = regions[k].avg_coded_err;
    pFVar8 = stats + lVar6;
    iVar7 = (iVar2 - iVar1) + 1;
    lVar9 = lVar6;
    do {
      if ((k != 0) || (lVar6 < lVar9)) {
        dVar15 = pFVar8->coded_error;
        if (pFVar8->coded_error <= pFVar8[-1].coded_error) {
          dVar15 = pFVar8[-1].coded_error;
        }
        if (dVar15 <= 0.001) {
          dVar15 = 0.001;
        }
        regions[k].avg_sr_fr_ratio =
             (pFVar8->sr_coded_error / dVar15) /
             (double)(int)(iVar2 - (iVar1 + -1 + (uint)(k == 0))) + regions[k].avg_sr_fr_ratio;
      }
      auVar16._8_8_ = pFVar8->coded_error;
      auVar16._0_8_ = pFVar8->intra_error;
      auVar3._8_8_ = dVar12;
      auVar3._0_8_ = dVar12;
      auVar17 = divpd(auVar16,auVar3);
      dVar13 = dVar13 + auVar17._0_8_;
      dVar14 = dVar14 + auVar17._8_8_;
      auVar17._0_8_ = pFVar8->noise_var;
      auVar17._8_8_ = pFVar8->cor_coeff;
      auVar17 = maxpd(auVar17,auVar5);
      auVar4._8_8_ = dVar12;
      auVar4._0_8_ = dVar12;
      auVar17 = divpd(auVar17,auVar4);
      dVar10 = dVar10 + auVar17._0_8_;
      dVar11 = dVar11 + auVar17._8_8_;
      lVar9 = lVar9 + 1;
      pFVar8 = pFVar8 + 1;
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
    regions[k].avg_intra_err = dVar13;
    regions[k].avg_coded_err = dVar14;
    regions[k].avg_noise_var = dVar10;
    regions[k].avg_cor_coeff = dVar11;
  }
  return;
}

Assistant:

static void analyze_region(const FIRSTPASS_STATS *stats, int k,
                           REGIONS *regions) {
  int i;
  regions[k].avg_cor_coeff = 0;
  regions[k].avg_sr_fr_ratio = 0;
  regions[k].avg_intra_err = 0;
  regions[k].avg_coded_err = 0;

  int check_first_sr = (k != 0);

  for (i = regions[k].start; i <= regions[k].last; i++) {
    if (i > regions[k].start || check_first_sr) {
      double num_frames =
          (double)(regions[k].last - regions[k].start + check_first_sr);
      double max_coded_error =
          AOMMAX(stats[i].coded_error, stats[i - 1].coded_error);
      double this_ratio =
          stats[i].sr_coded_error / AOMMAX(max_coded_error, 0.001);
      regions[k].avg_sr_fr_ratio += this_ratio / num_frames;
    }

    regions[k].avg_intra_err +=
        stats[i].intra_error / (double)(regions[k].last - regions[k].start + 1);
    regions[k].avg_coded_err +=
        stats[i].coded_error / (double)(regions[k].last - regions[k].start + 1);

    regions[k].avg_cor_coeff +=
        AOMMAX(stats[i].cor_coeff, 0.001) /
        (double)(regions[k].last - regions[k].start + 1);
    regions[k].avg_noise_var +=
        AOMMAX(stats[i].noise_var, 0.001) /
        (double)(regions[k].last - regions[k].start + 1);
  }
}